

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util-ossl.cpp
# Opt level: O3

int crypto_import_key_pair
              (CK_SESSION_HANDLE hSession,char *filePath,char *filePIN,char *label,char *objID,
              size_t objIDLen,int noPublicKey)

{
  int iVar1;
  EVP_PKEY *pkey;
  ec_key_st *ecdsa;
  dsa_st *r;
  rsa_st *r_00;
  
  pkey = (EVP_PKEY *)crypto_read_file(filePath,filePIN);
  if (pkey == (EVP_PKEY *)0x0) {
    return 1;
  }
  iVar1 = EVP_PKEY_get_id(pkey);
  iVar1 = EVP_PKEY_type(iVar1);
  if (iVar1 < 0x40a) {
    if (iVar1 == 6) {
      r_00 = EVP_PKEY_get1_RSA(pkey);
      EVP_PKEY_free(pkey);
      if (r_00 != (rsa_st *)0x0) {
        iVar1 = crypto_save_rsa(hSession,label,objID,objIDLen,noPublicKey,(RSA *)r_00);
        RSA_free(r_00);
        return iVar1;
      }
    }
    else if (iVar1 == 0x74) {
      r = EVP_PKEY_get1_DSA(pkey);
      EVP_PKEY_free(pkey);
      if (r != (dsa_st *)0x0) {
        iVar1 = crypto_save_dsa(hSession,label,objID,objIDLen,noPublicKey,(DSA *)r);
        DSA_free(r);
        return iVar1;
      }
    }
    else {
      if (iVar1 != 0x198) goto LAB_0011500e;
      ecdsa = EVP_PKEY_get1_EC_KEY(pkey);
      EVP_PKEY_free(pkey);
      if (ecdsa != (ec_key_st *)0x0) {
        iVar1 = crypto_save_ecdsa(hSession,label,objID,objIDLen,noPublicKey,(EC_KEY *)ecdsa);
        EC_KEY_free(ecdsa);
        return iVar1;
      }
    }
    crypto_import_key_pair();
  }
  else {
    if ((iVar1 - 0x40aU < 0x37) &&
       ((0x60000000000003U >> ((ulong)(iVar1 - 0x40aU) & 0x3f) & 1) != 0)) {
      EVP_PKEY_up_ref(pkey);
      EVP_PKEY_free(pkey);
      iVar1 = crypto_save_eddsa(hSession,label,objID,objIDLen,noPublicKey,(EVP_PKEY *)pkey);
      EVP_PKEY_free(pkey);
      return iVar1;
    }
LAB_0011500e:
    crypto_import_key_pair();
  }
  return 1;
}

Assistant:

int crypto_import_key_pair
(
	CK_SESSION_HANDLE hSession,
	char* filePath,
	char* filePIN,
	char* label,
	char* objID,
	size_t objIDLen,
	int noPublicKey
)
{
	EVP_PKEY* pkey = crypto_read_file(filePath, filePIN);
	if (pkey == NULL)
	{
		return 1;
	}

	RSA* rsa = NULL;
	DSA* dsa = NULL;
#ifdef WITH_ECC
	EC_KEY* ecdsa = NULL;
#endif
#ifdef WITH_EDDSA
	EVP_PKEY* eddsa = NULL;
#endif

	switch (EVP_PKEY_type(EVP_PKEY_id(pkey)))
	{
		case EVP_PKEY_RSA:
			rsa = EVP_PKEY_get1_RSA(pkey);
			break;
		case EVP_PKEY_DSA:
			dsa = EVP_PKEY_get1_DSA(pkey);
			break;
#ifdef WITH_ECC
		case EVP_PKEY_EC:
			ecdsa = EVP_PKEY_get1_EC_KEY(pkey);
			break;
#endif
#ifdef WITH_EDDSA
		case NID_X25519:
		case NID_ED25519:
		case NID_X448:
		case NID_ED448:
			EVP_PKEY_up_ref(pkey);
			eddsa = pkey;
			break;
#endif
		default:
			fprintf(stderr, "ERROR: Cannot handle this algorithm.\n");
			EVP_PKEY_free(pkey);
			return 1;
			break;
	}
	EVP_PKEY_free(pkey);

	int result = 0;

	if (rsa)
	{
		result = crypto_save_rsa(hSession, label, objID, objIDLen, noPublicKey, rsa);
		RSA_free(rsa);
	}
	else if (dsa)
	{
		result = crypto_save_dsa(hSession, label, objID, objIDLen, noPublicKey, dsa);
		DSA_free(dsa);
	}
#ifdef WITH_ECC
	else if (ecdsa)
	{
		result = crypto_save_ecdsa(hSession, label, objID, objIDLen, noPublicKey, ecdsa);
		EC_KEY_free(ecdsa);
	}
#endif
#ifdef WITH_EDDSA
	else if (eddsa)
	{
		result = crypto_save_eddsa(hSession, label, objID, objIDLen, noPublicKey, eddsa);
		EVP_PKEY_free(eddsa);
	}
#endif
	else
	{
		fprintf(stderr, "ERROR: Could not get the key material.\n");
		result = 1;
	}